

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O1

Path * __thiscall Pathie::Path::absolute(Path *__return_storage_ptr__,Path *this,Path *base)

{
  char *pcVar1;
  _Alloc_hider _Var2;
  string local_60;
  string local_40;
  
  pcVar1 = (this->m_path)._M_dataplus._M_p;
  if (*pcVar1 == '/') {
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_40,pcVar1,pcVar1 + (this->m_path)._M_string_length);
    Path(__return_storage_ptr__,&local_40);
    _Var2._M_p = local_40._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p == &local_40.field_2) {
      return __return_storage_ptr__;
    }
  }
  else {
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_60,pcVar1,pcVar1 + (this->m_path)._M_string_length);
    join(__return_storage_ptr__,base,&local_60);
    _Var2._M_p = local_60._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p == &local_60.field_2) {
      return __return_storage_ptr__;
    }
  }
  operator_delete(_Var2._M_p);
  return __return_storage_ptr__;
}

Assistant:

Path Path::absolute(const Path& base /* = Path::pwd() */) const
{
  if (is_absolute())
    return Path(m_path);
  else
    return base.join(m_path);
}